

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O3

ON_SubD * ON_SubD::CreateSubDBox
                    (ON_3dPoint *corners,ON_SubDEdgeTag edge_tag,uint facecount_x,uint facecount_y,
                    uint facecount_z,ON_SubD *destination_subd)

{
  double *pdVar1;
  ON_SubD *pOVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,edge_tag) == 2) {
    pdVar1 = &ON_SubDEdgeSharpness::CreaseValue;
  }
  else {
    pdVar1 = &ON_SubDEdgeSharpness::SmoothValue;
  }
  pOVar2 = CreateSubDBox(corners,*pdVar1,facecount_x,facecount_y,facecount_z,destination_subd);
  return pOVar2;
}

Assistant:

ON_SubD* ON_SubD::CreateSubDBox(
  const ON_3dPoint corners[8],
  ON_SubDEdgeTag edge_tag,
  unsigned int facecount_x,
  unsigned int facecount_y,
  unsigned int facecount_z,
  ON_SubD* destination_subd)
{
  double edge_sharpness
    = ON_SubDEdgeTag::Crease == edge_tag
    ? ON_SubDEdgeSharpness::CreaseValue
    : ON_SubDEdgeSharpness::SmoothValue
    ;

  return ON_SubD::CreateSubDBox(
    corners,
    edge_sharpness,
    facecount_x,
    facecount_y,
    facecount_z,
    destination_subd
  );
}